

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cc
# Opt level: O0

void __thiscall Thread::Join(Thread *this)

{
  ostream *poVar1;
  void *local_328;
  void *val;
  LogMessage local_190;
  Thread *local_10;
  Thread *this_local;
  
  local_10 = this;
  if ((this->running_ & 1U) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/thread.cc",
               0x20);
    poVar1 = LogMessage::stream(&local_190);
    std::operator<<(poVar1,"Check failed: running_");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  if ((this->joinable_ & 1U) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&val,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/thread.cc",
               0x21);
    poVar1 = LogMessage::stream((LogMessage *)&val);
    std::operator<<(poVar1,"Check failed: joinable_");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&val);
  }
  pthread_join(this->pid_,&local_328);
  this->running_ = false;
  return;
}

Assistant:

void Thread::Join() {
  CHECK(running_);
  CHECK(joinable_);
  void *val;
  pthread_join(pid_, &val);
  running_ = 0;
}